

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_plugin.c
# Opt level: O0

mk_plugin * mk_plugin_lookup(char *shortname,mk_server *server)

{
  int iVar1;
  mk_list *__mptr;
  mk_plugin *p;
  mk_list *head;
  mk_server *server_local;
  char *shortname_local;
  
  p = (mk_plugin *)(server->plugins).next;
  while( true ) {
    if (p == (mk_plugin *)&server->plugins) {
      return (mk_plugin *)0x0;
    }
    iVar1 = strcmp((char *)p[-1].exit_plugin,shortname);
    if (iVar1 == 0) break;
    p = (mk_plugin *)p->shortname;
  }
  return (mk_plugin *)&p[-1].init_plugin;
}

Assistant:

struct mk_plugin *mk_plugin_lookup(char *shortname, struct mk_server *server)
{
    struct mk_list *head;
    struct mk_plugin *p = NULL;

    mk_list_foreach(head, &server->plugins) {
        p = mk_list_entry(head, struct mk_plugin, _head);
        if (strcmp(p->shortname, shortname) == 0){
            return p;
        }
    }

    return NULL;
}